

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-ping-udp.c
# Opt level: O1

void pinger_read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  pinger_t *pinger;
  char *pcVar1;
  int iVar2;
  uint64_t uVar3;
  ulong uVar4;
  ssize_t sVar5;
  pinger_t *ppVar6;
  long lVar7;
  
  if (nread < 0) {
    if (nread == -0xfff) {
      pcVar1 = buf->base;
      if (pcVar1 != (char *)0x0) {
        *(buf_t **)(pcVar1 + -8) = buf_freelist;
        buf_freelist = (buf_t *)(pcVar1 + -0x18);
      }
      if (pinger_shutdown_cb_called == 1) {
        uv_close((uv_handle_t *)tcp,pinger_close_cb);
        return;
      }
    }
    else {
LAB_0010c25d:
      pinger_read_cb_cold_2();
    }
    iVar2 = (int)nread;
    pinger_read_cb_cold_3();
    if (iVar2 == 0) {
      free(tcp);
      return;
    }
    pinger_write_cb_cold_1();
    if (iVar2 == 0) {
      pinger_shutdown_cb_called = pinger_shutdown_cb_called + 1;
      if (completed_pingers == 0) {
        return;
      }
    }
    else {
      pinger_shutdown_cb_cold_1();
    }
    pinger_shutdown_cb_cold_2();
    iVar2 = uv_is_closing((uv_handle_t *)tcp);
    if (iVar2 == 0) {
      uv_close((uv_handle_t *)tcp,(uv_close_cb)0x0);
      return;
    }
    return;
  }
  if (nread != 0) {
    pinger = (pinger_t *)tcp->data;
    lVar7 = 0;
    sVar5 = nread;
    ppVar6 = (pinger_t *)tcp;
    do {
      if (buf->base[lVar7] != PING[pinger->state]) {
        pinger_read_cb_cold_1();
        nread = sVar5;
        tcp = (uv_stream_t *)ppVar6;
        goto LAB_0010c25d;
      }
      uVar4 = ((long)pinger->state + 1U) % 5;
      pinger->state = (int)uVar4;
      if (uVar4 == 0) {
        pinger->pongs = pinger->pongs + 1;
        uVar3 = uv_now(loop);
        if (5000 < uVar3 - start_time) {
          uv_shutdown(&pinger->shutdown_req,tcp,pinger_shutdown_cb);
          break;
        }
        ppVar6 = pinger;
        pinger_write_ping(pinger);
      }
      lVar7 = lVar7 + 1;
    } while (nread != lVar7);
  }
  pcVar1 = buf->base;
  *(buf_t **)(pcVar1 + -8) = buf_freelist;
  buf_freelist = (buf_t *)(pcVar1 + -0x18);
  return;
}

Assistant:

static void pinger_read_cb(uv_udp_t* udp,
                           ssize_t nread,
                           const uv_buf_t* buf,
                           const struct sockaddr* addr,
                           unsigned flags) {
  ssize_t i;
  pinger_t* pinger;
  pinger = (pinger_t*)udp->data;

  /* Now we count the pings */
  for (i = 0; i < nread; i++) {
    ASSERT(buf->base[i] == PING[pinger->state]);
    pinger->state = (pinger->state + 1) % (sizeof(PING) - 1);
    if (pinger->state == 0) {
      pinger->pongs++;
      if (uv_now(loop) - start_time > TIME) {
        uv_close((uv_handle_t*)udp, pinger_close_cb);
        break;
      }
      pinger_write_ping(pinger);
    }
  }

  buf_free(buf);
}